

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
DeleteSubrange(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,int start,int num)

{
  int iVar1;
  Arena *pAVar2;
  undefined8 *puVar3;
  Rep *pRVar4;
  void **ppvVar5;
  Nonnull<const_char_*> pcVar6;
  ulong uVar7;
  
  if (start < 0) {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)start,0,"start >= 0");
  }
  else {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar6 == (Nonnull<const_char_*>)0x0) {
    if (num < 0) {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)num,0,"num >= 0");
    }
    else {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar6 == (Nonnull<const_char_*>)0x0) {
      iVar1 = (this->super_RepeatedPtrFieldBase).current_size_;
      if (iVar1 < num + start) {
        pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           ((long)(num + start),(long)iVar1,"start + num <= size()");
      }
      else {
        pcVar6 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar6 == (Nonnull<const_char_*>)0x0) {
        ppvVar5 = (void **)this;
        if (((ulong)(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
          pRVar4 = internal::RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
          ppvVar5 = pRVar4->elements;
        }
        if (0 < num) {
          pAVar2 = (this->super_RepeatedPtrFieldBase).arena_;
          uVar7 = 0;
          do {
            if ((pAVar2 == (Arena *)0x0) &&
               (puVar3 = (undefined8 *)ppvVar5[(long)start + uVar7], puVar3 != (undefined8 *)0x0)) {
              if ((long *)*puVar3 != puVar3 + 2) {
                operator_delete((long *)*puVar3,puVar3[2] + 1);
              }
              operator_delete(puVar3,0x20);
            }
            uVar7 = uVar7 + 1;
          } while ((uint)num != uVar7);
        }
        UnsafeArenaExtractSubrange
                  (this,start,num,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0);
        return;
      }
      goto LAB_001e1a09;
    }
  }
  else {
    RepeatedPtrField<std::__cxx11::string>::DeleteSubrange();
  }
  RepeatedPtrField<std::__cxx11::string>::DeleteSubrange();
LAB_001e1a09:
  RepeatedPtrField<std::__cxx11::string>::DeleteSubrange();
}

Assistant:

inline void RepeatedPtrField<Element>::DeleteSubrange(int start, int num) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  ABSL_DCHECK_LE(start + num, size());
  void** subrange = raw_mutable_data() + start;
  Arena* arena = GetArena();
  for (int i = 0; i < num; ++i) {
    using H = CommonHandler<TypeHandler>;
    H::Delete(static_cast<Element*>(subrange[i]), arena);
  }
  UnsafeArenaExtractSubrange(start, num, nullptr);
}